

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromMatArray::load
          (Mat *__return_storage_ptr__,ModelBinFromMatArray *this,int param_1,int param_2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *pMVar5;
  Mat *m;
  
  pMVar5 = this->weights;
  if (pMVar5 != (Mat *)0x0) {
    __return_storage_ptr__->data = pMVar5->data;
    piVar1 = pMVar5->refcount;
    __return_storage_ptr__->refcount = piVar1;
    __return_storage_ptr__->elemsize = pMVar5->elemsize;
    __return_storage_ptr__->elempack = pMVar5->elempack;
    __return_storage_ptr__->allocator = pMVar5->allocator;
    iVar2 = pMVar5->w;
    iVar3 = pMVar5->h;
    iVar4 = pMVar5->c;
    __return_storage_ptr__->dims = pMVar5->dims;
    __return_storage_ptr__->w = iVar2;
    __return_storage_ptr__->h = iVar3;
    __return_storage_ptr__->c = iVar4;
    __return_storage_ptr__->cstep = pMVar5->cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      pMVar5 = this->weights;
    }
    this->weights = pMVar5 + 1;
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!weights)
        return Mat();

    Mat m = weights[0];
    weights++;
    return m;
}